

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O0

void __thiscall amrex::MLMG::makeSolvable(MLMG *this)

{
  long *plVar1;
  Any *pAVar2;
  Long LVar3;
  Print *this_00;
  int *in_RDI;
  int alev;
  int c;
  int ncomp;
  Vector<double,_std::allocator<double>_> *offset;
  char (*in_stack_fffffffffffffde8) [21];
  Print *in_stack_fffffffffffffdf0;
  Vector<amrex::Any,_std::allocator<amrex::Any>_> *this_01;
  Print *in_stack_fffffffffffffe18;
  int local_1c8;
  Print *in_stack_fffffffffffffe60;
  int local_30;
  undefined1 local_28 [24];
  undefined1 *local_10;
  
  plVar1 = *(long **)(in_RDI + 0x12);
  pAVar2 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                     ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_fffffffffffffdf0,
                      (size_type)in_stack_fffffffffffffde8);
  (**(code **)(*plVar1 + 0xd8))(local_28,plVar1,0,0,pAVar2);
  local_10 = local_28;
  if (3 < *in_RDI) {
    LVar3 = Vector<double,_std::allocator<double>_>::size
                      ((Vector<double,_std::allocator<double>_> *)0x125c8ad);
    for (local_30 = 0; local_30 < (int)LVar3; local_30 = local_30 + 1) {
      this_00 = (Print *)OutStream();
      Print::Print(this_00,(ostream *)in_stack_fffffffffffffe18);
      in_stack_fffffffffffffe18 =
           Print::operator<<(in_stack_fffffffffffffdf0,(char (*) [19])in_stack_fffffffffffffde8);
      Vector<double,_std::allocator<double>_>::operator[]
                ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdf0,
                 (size_type)in_stack_fffffffffffffde8);
      Print::operator<<(in_stack_fffffffffffffdf0,(double *)in_stack_fffffffffffffde8);
      Print::operator<<(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      Print::operator<<(in_stack_fffffffffffffdf0,(int *)in_stack_fffffffffffffde8);
      Print::operator<<(in_stack_fffffffffffffdf0,(char (*) [2])in_stack_fffffffffffffde8);
      Print::~Print(in_stack_fffffffffffffe60);
    }
  }
  for (local_1c8 = 0; local_1c8 < in_RDI[0x14]; local_1c8 = local_1c8 + 1) {
    this_01 = *(Vector<amrex::Any,_std::allocator<amrex::Any>_> **)(in_RDI + 0x12);
    pAVar2 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                       (this_01,(size_type)in_stack_fffffffffffffde8);
    (*(code *)(this_01->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
              super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
              super__Vector_impl_data._M_start[0x1c].m_ptr._M_t)
              (this_01,local_1c8,0,pAVar2,local_10);
  }
  Vector<double,_std::allocator<double>_>::~Vector
            ((Vector<double,_std::allocator<double>_> *)0x125ca42);
  return;
}

Assistant:

void
MLMG::makeSolvable ()
{
    auto const& offset = linop.getSolvabilityOffset(0, 0, rhs[0]);
    if (verbose >= 4) {
        const int ncomp = offset.size();
        for (int c = 0; c < ncomp; ++c) {
            amrex::Print() << "MLMG: Subtracting " << offset[c] << " from rhs component "
                           << c << "\n";
        }
    }
    for (int alev = 0; alev < namrlevs; ++alev) {
        linop.fixSolvabilityByOffset(alev, 0, rhs[alev], offset);
    }
}